

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_is_hardlink(char *file,wchar_t line,char *path1,char *path2)

{
  wchar_t wVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  char *in_RDI;
  char *in_stack_00000100;
  char *in_stack_00000108;
  wchar_t in_stack_00000114;
  char *in_stack_00000118;
  wchar_t local_4;
  
  wVar1 = is_hardlink(in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100);
  if (wVar1 == L'\0') {
    failure_start(in_RDI,(wchar_t)(ulong)in_ESI,"Files %s and %s are not hardlinked",in_RDX,in_RCX);
    failure_finish((void *)0x105c55);
  }
  local_4 = (wchar_t)(wVar1 != L'\0');
  return local_4;
}

Assistant:

int
assertion_is_hardlink(const char *file, int line,
    const char *path1, const char *path2)
{
	if (is_hardlink(file, line, path1, path2))
		return (1);
	failure_start(file, line,
	    "Files %s and %s are not hardlinked", path1, path2);
	failure_finish(NULL);
	return (0);
}